

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O3

void * Dsm_ManDeriveGia(void *pGia,int fUseMuxes)

{
  ulong *puVar1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *p;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  uint *puVar12;
  Gia_Obj_t *pGVar13;
  Vec_Int_t *vCover;
  Gia_Obj_t *pGVar14;
  word *pTruth;
  Gia_Man_t *pGVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  
  if (*(long *)((long)pGia + 0x108) == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                  ,0x1ff,"void *Dsm_ManDeriveGia(void *, int)");
  }
  p = Gia_ManStart((*(int *)((long)pGia + 0x18) * 6) / 5 + 100);
  pcVar3 = *pGia;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p->pName = pcVar9;
  pcVar3 = *(char **)((long)pGia + 8);
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p->pSpec = pcVar9;
  iVar7 = *(int *)((long)pGia + 0x18) * 6;
  iVar5 = iVar7 >> 0x1f;
  iVar7 = iVar7 / 5 + iVar5;
  iVar20 = (iVar7 - iVar5) + 100;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < (iVar7 - iVar5) + 99U) {
    iVar6 = iVar20;
  }
  pVVar10->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar10->pArray = (int *)0x0;
    pVVar10->nSize = iVar20;
  }
  else {
    piVar11 = (int *)malloc((long)iVar6 << 2);
    pVVar10->pArray = piVar11;
    pVVar10->nSize = iVar20;
    if (piVar11 != (int *)0x0) {
      memset(piVar11,0,(long)iVar20 << 2);
    }
  }
  p->vLevels = pVVar10;
  if (fUseMuxes != 0) {
    puVar12 = (uint *)calloc((long)p->nObjsAlloc,4);
    p->pMuxes = puVar12;
  }
  Gia_ManFillValue((Gia_Man_t *)pGia);
  *(undefined4 *)(*(long *)((long)pGia + 0x20) + 8) = 0;
  lVar26 = *(long *)((long)pGia + 0x40);
  if (0 < *(int *)(lVar26 + 4)) {
    lVar24 = 0;
    do {
      iVar7 = *(int *)(*(long *)(lVar26 + 8) + lVar24 * 4);
      if (((long)iVar7 < 0) || (*(int *)((long)pGia + 0x18) <= iVar7)) goto LAB_00519c76;
      lVar26 = *(long *)((long)pGia + 0x20);
      if (lVar26 == 0) break;
      pGVar13 = Gia_ManAppendObj(p);
      uVar17 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar17 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar17 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar14 = p->pObjs;
      if ((pGVar13 < pGVar14) || (pGVar14 + p->nObjs <= pGVar13)) goto LAB_00519c95;
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar14) >> 2) * -0x55555555);
      pGVar14 = p->pObjs;
      if ((pGVar13 < pGVar14) || (pGVar14 + p->nObjs <= pGVar13)) goto LAB_00519c95;
      *(int *)(lVar26 + 8 + (long)iVar7 * 0xc) =
           (int)((ulong)((long)pGVar13 - (long)pGVar14) >> 2) * 0x55555556;
      lVar24 = lVar24 + 1;
      lVar26 = *(long *)((long)pGia + 0x40);
    } while (lVar24 < *(int *)(lVar26 + 4));
  }
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 0x10;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  pVVar10->pArray = piVar11;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar11 = (int *)malloc(0x40000);
  vCover->pArray = piVar11;
  Gia_ManHashStart(p);
  iVar7 = Gia_ManLutSizeMax((Gia_Man_t *)pGia);
  Gia_ObjComputeTruthTableStart((Gia_Man_t *)pGia,iVar7);
  uVar17 = (ulong)*(uint *)((long)pGia + 0x18);
  if (0 < (int)*(uint *)((long)pGia + 0x18)) {
    lVar26 = 0;
    do {
      if (*(long *)((long)pGia + 0x20) == 0) break;
      puVar1 = (ulong *)(*(long *)((long)pGia + 0x20) + lVar26 * 0xc);
      uVar18 = *puVar1;
      uVar21 = (uint)uVar18;
      if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar21) {
        if (((uVar21 & 0x1fffffff) == 0x1fffffff) ||
           ((uVar21 & 0x1fffffff) != ((uint)(uVar18 >> 0x20) & 0x1fffffff))) {
          lVar24 = *(long *)((long)pGia + 0x108);
          if (*(int *)(lVar24 + 4) <= lVar26) goto LAB_00519c57;
          if (*(int *)(*(long *)(lVar24 + 8) + lVar26 * 4) != 0) {
            pVVar10->nSize = 0;
            lVar16 = (long)*(int *)(lVar24 + 4);
            if (lVar16 <= lVar26) {
LAB_00519c57:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar22 = 0;
            while( true ) {
              lVar24 = *(long *)(lVar24 + 8);
              uVar21 = *(uint *)(lVar24 + lVar26 * 4);
              lVar19 = (long)(int)uVar21;
              if ((lVar19 < 0) || ((uint)lVar16 <= uVar21)) goto LAB_00519c57;
              if (*(int *)(lVar24 + lVar19 * 4) <= lVar22) break;
              Vec_IntPush(pVVar10,*(int *)(lVar24 + lVar19 * 4 + 4 + lVar22 * 4));
              lVar22 = lVar22 + 1;
              lVar24 = *(long *)((long)pGia + 0x108);
              lVar16 = (long)*(int *)(lVar24 + 4);
              if (lVar16 <= lVar26) goto LAB_00519c57;
            }
            if (*(int *)((long)pGia + 0x18) <= lVar26) goto LAB_00519c76;
            pTruth = Gia_ObjComputeTruthTableCut
                               ((Gia_Man_t *)pGia,
                                (Gia_Obj_t *)(lVar26 * 0xc + *(long *)((long)pGia + 0x20)),pVVar10);
            pVVar10->nSize = 0;
            lVar24 = *(long *)((long)pGia + 0x108);
            lVar16 = (long)*(int *)(lVar24 + 4);
            if (lVar16 <= lVar26) goto LAB_00519c57;
            lVar22 = 0;
            while( true ) {
              lVar24 = *(long *)(lVar24 + 8);
              uVar21 = *(uint *)(lVar24 + lVar26 * 4);
              lVar19 = (long)(int)uVar21;
              if ((lVar19 < 0) || ((uint)lVar16 <= uVar21)) goto LAB_00519c57;
              if (*(int *)(lVar24 + lVar19 * 4) <= lVar22) break;
              iVar7 = *(int *)(lVar24 + lVar19 * 4 + 4 + lVar22 * 4);
              if (((long)iVar7 < 0) || (*(int *)((long)pGia + 0x18) <= iVar7)) goto LAB_00519c76;
              Vec_IntPush(pVVar10,*(int *)(*(long *)((long)pGia + 0x20) + 8 + (long)iVar7 * 0xc));
              lVar22 = lVar22 + 1;
              lVar24 = *(long *)((long)pGia + 0x108);
              lVar16 = (long)*(int *)(lVar24 + 4);
              if (lVar16 <= lVar26) goto LAB_00519c57;
            }
            iVar7 = Dsm_ManTruthToGia(p,pTruth,pVVar10,vCover);
            uVar17 = (ulong)*(int *)((long)pGia + 0x18);
            if ((long)uVar17 <= lVar26) goto LAB_00519c76;
            *(int *)(*(long *)((long)pGia + 0x20) + 8 + lVar26 * 0xc) = iVar7;
          }
        }
        else {
          uVar23 = *(uint *)((long)puVar1 + (uVar18 & 0x1fffffff) * -0xc + 8);
          if ((int)uVar23 < 0) goto LAB_00519cb4;
          pGVar14 = Gia_ManAppendObj(p);
          if (p->nObjs <= (int)(uVar23 >> 1)) {
            __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x30c,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
          }
          pGVar13 = p->pObjs;
          if ((pGVar14 < pGVar13) || (pGVar13 + (uint)p->nObjs <= pGVar14)) goto LAB_00519c95;
          uVar17 = (ulong)(((uint)((int)pGVar14 - (int)pGVar13) >> 2) * -0x55555555 - (uVar23 >> 1)
                          & 0x1fffffff);
          uVar21 = (uVar23 ^ uVar21 >> 0x1d) & 1;
          *(ulong *)pGVar14 =
               (ulong)(uVar21 << 0x1d) |
               (ulong)uVar21 << 0x3d | *(ulong *)pGVar14 & 0xc0000000c0000000 | uVar17 << 0x20 |
               uVar17;
          p->nBufs = p->nBufs + 1;
          pGVar13 = p->pObjs;
          if ((pGVar14 < pGVar13) || (pGVar13 + p->nObjs <= pGVar14)) goto LAB_00519c95;
          *(int *)(puVar1 + 1) = (int)((ulong)((long)pGVar14 - (long)pGVar13) >> 2) * 0x55555556;
          uVar17 = (ulong)*(uint *)((long)pGia + 0x18);
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < (int)uVar17);
  }
  Gia_ObjComputeTruthTableStop((Gia_Man_t *)pGia);
  lVar26 = *(long *)((long)pGia + 0x48);
  if (0 < *(int *)(lVar26 + 4)) {
    lVar24 = 0;
    do {
      iVar7 = *(int *)(*(long *)(lVar26 + 8) + lVar24 * 4);
      if (((long)iVar7 < 0) || (*(int *)((long)pGia + 0x18) <= iVar7)) {
LAB_00519c76:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (*(long *)((long)pGia + 0x20) == 0) break;
      puVar2 = (undefined8 *)(*(long *)((long)pGia + 0x20) + (long)iVar7 * 0xc);
      uVar4 = *puVar2;
      uVar21 = *(uint *)((long)puVar2 + (ulong)((uint)uVar4 & 0x1fffffff) * -0xc + 8);
      if ((int)uVar21 < 0) {
LAB_00519cb4:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar23 = uVar21 >> 1;
      if (p->nObjs <= (int)uVar23) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      if ((~*(uint *)(p->pObjs + uVar23) & 0x1fffffff) != 0 && (int)*(uint *)(p->pObjs + uVar23) < 0
         ) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar13 = Gia_ManAppendObj(p);
      uVar17 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar17 | 0x80000000;
      pGVar14 = p->pObjs;
      if ((pGVar13 < pGVar14) || (pGVar14 + p->nObjs <= pGVar13)) {
LAB_00519c95:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar18 = (ulong)(((uint)((int)pGVar13 - (int)pGVar14) >> 2) * -0x55555555 - uVar23 &
                      0x1fffffff);
      uVar25 = (ulong)((uVar21 << 0x1d ^ (uint)uVar4) & 0x20000000);
      *(ulong *)pGVar13 = uVar25 | uVar17 & 0xffffffffc0000000 | 0x80000000 | uVar18;
      *(ulong *)pGVar13 =
           uVar25 | uVar17 & 0xe0000000c0000000 | 0x80000000 | uVar18 |
           (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar14 = p->pObjs;
      if ((pGVar13 < pGVar14) || (pGVar14 + p->nObjs <= pGVar13)) goto LAB_00519c95;
      Vec_IntPush(p->vCos,(int)((ulong)((long)pGVar13 - (long)pGVar14) >> 2) * -0x55555555);
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),pGVar13);
      }
      pGVar14 = p->pObjs;
      if ((pGVar13 < pGVar14) || (pGVar14 + p->nObjs <= pGVar13)) goto LAB_00519c95;
      *(int *)(puVar2 + 1) = (int)((ulong)((long)pGVar13 - (long)pGVar14) >> 2) * 0x55555556;
      lVar24 = lVar24 + 1;
      lVar26 = *(long *)((long)pGia + 0x48);
    } while (lVar24 < *(int *)(lVar26 + 4));
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,*(int *)((long)pGia + 0x10));
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
  }
  free(pVVar10);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
  }
  free(vCover);
  pGVar15 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar15;
}

Assistant:

void * Dsm_ManDeriveGia( void * pGia, int fUseMuxes )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vCover, * vLeaves;
    Gia_Obj_t * pObj; 
    int k, i, iLut, iVar;
    word * pTruth;
    assert( Gia_ManHasMapping(p) );   
    // create new manager
    pNew = Gia_ManStart( 6*Gia_ManObjNum(p)/5 + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->vLevels = Vec_IntStart( 6*Gia_ManObjNum(p)/5 + 100 );
    if ( fUseMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    // map primary inputs
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // iterate through nodes used in the mapping
    vLeaves = Vec_IntAlloc( 16 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    Gia_ManHashStart( pNew );
    Gia_ObjComputeTruthTableStart( p, Gia_ManLutSizeMax(p) );
    Gia_ManForEachAnd( p, pObj, iLut )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            continue;
        }
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        // collect leaves
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, iVar );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, iLut), vLeaves );
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, Gia_ManObj(p, iVar)->Value );
        Gia_ManObj(p, iLut)->Value = Dsm_ManTruthToGia( pNew, pTruth, vLeaves, vCover );
    }
    Gia_ObjComputeTruthTableStop( p );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
/*
    Gia_ManForEachAnd( pNew, pObj, i )
    {
        int iLev  = Gia_ObjLevelId(pNew, i);
        int iLev0 = Gia_ObjLevelId(pNew, Gia_ObjFaninId0(pObj, i));
        int iLev1 = Gia_ObjLevelId(pNew, Gia_ObjFaninId1(pObj, i));
        assert( iLev == 1 + Abc_MaxInt(iLev0, iLev1) );
    }
*/
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}